

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MilStorage.cpp
# Opt level: O0

u_int64_t __thiscall
CoreML::MilStoragePython::MilStoragePythonWriter::write_int4_data
          (MilStoragePythonWriter *this,array_t<signed_char,_16> *data)

{
  Span<const_signed_char,_18446744073709551615UL> unpackedValues;
  char *p;
  size_t size;
  uchar *p_00;
  size_type size_00;
  SpanSize<18446744073709551615UL> SVar1;
  pointer this_00;
  uint64_t uVar2;
  size_t in_RCX;
  Span<const_unsigned_char,_18446744073709551615UL> span;
  Span<const_MILBlob::Int4,_18446744073709551615UL> data_00;
  Span<const_MILBlob::Int4,_18446744073709551615UL> int4Span;
  undefined1 auStack_68 [8];
  Span<const_unsigned_char,_18446744073709551615UL> packedValuesSpan;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> packedValues;
  Span<const_signed_char,_18446744073709551615UL> int8SpanData;
  array_t<signed_char,_16> *data_local;
  MilStoragePythonWriter *this_local;
  
  p = pybind11::array_t<signed_char,_16>::data<>(data);
  size = pybind11::array::size(&data->super_array);
  MILBlob::Util::Span<const_signed_char,_18446744073709551615UL>::Span<18446744073709551615UL,_0>
            ((Span<const_signed_char,_18446744073709551615UL> *)
             &packedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,p,size);
  packedValuesSpan.m_size.m_size =
       (size_t)packedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  unpackedValues.m_size.m_size = (size_t)int8SpanData.m_ptr;
  unpackedValues.m_ptr =
       (pointer)packedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  MILBlob::PackInt8Span<MILBlob::Int4>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,unpackedValues);
  p_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  size_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::Span<18446744073709551615UL,_0>
            ((Span<const_unsigned_char,_18446744073709551615UL> *)auStack_68,p_00,size_00);
  SVar1.m_size = pybind11::array::size(&data->super_array);
  span.m_size.m_size = SVar1.m_size;
  span.m_ptr = packedValuesSpan.m_ptr;
  data_00 = MILBlob::Util::CastToBitSpan<const_MILBlob::Int4,_const_unsigned_char,_true>
                      ((Util *)auStack_68,span,in_RCX);
  this_00 = std::
            unique_ptr<MILBlob::Blob::StorageWriter,_std::default_delete<MILBlob::Blob::StorageWriter>_>
            ::operator->(&this->m_writer);
  uVar2 = MILBlob::Blob::StorageWriter::WriteData<MILBlob::Int4>(this_00,data_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return uVar2;
}

Assistant:

u_int64_t MilStoragePythonWriter::write_int4_data(const py::array_t<int8_t>& data) {
    // The `data` is stored in int8 because numpy doesn't support int4.
    // First pack those int4 data into uint8 Span, and then cast to int4 Span and write it.
    auto int8SpanData = MILBlob::Util::Span<const int8_t>(data.data(), data.size());
    std::vector<uint8_t> packedValues = MILBlob::PackInt8Span<MILBlob::Int4>(int8SpanData);
    auto packedValuesSpan = MILBlob::Util::Span<const uint8_t>(packedValues.data(), packedValues.size());
    auto int4Span = MILBlob::Util::CastToBitSpan<const MILBlob::Int4>(packedValuesSpan, data.size());
    return m_writer->WriteData<MILBlob::Int4>(int4Span);
}